

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conspage.c
# Opt level: O1

LispPTR N_OP_cons(LispPTR cons_car,LispPTR cons_cdr)

{
  LispPTR *pLVar1;
  DLword *pDVar2;
  dtd *pdVar3;
  ConsCell *pCVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  conspage *pcVar9;
  LispPTR LVar8;
  
  uVar6 = cons_cdr & 0xfffffff;
  if ((-1 < *(short *)((ulong)((uVar6 >> 9) * 2) + (long)MDStypetbl ^ 2)) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(uVar6,0);
    }
    else {
      htfind(uVar6,0);
    }
  }
  if ((-1 < *(short *)((ulong)(cons_car >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(cons_car,0);
    }
    else {
      htfind(cons_car,0);
    }
  }
  pdVar3 = ListpDTD;
  pDVar2 = Lisp_world;
  if (uVar6 == 0) {
    LVar8 = ListpDTD->dtd_nextpage;
    if (LVar8 == 0) {
      pCVar4 = (ConsCell *)0x0;
    }
    else {
      pCVar4 = (ConsCell *)0x0;
      do {
        uVar7 = LVar8 << 8;
        uVar6 = *(uint *)(pDVar2 + (ulong)uVar7 + 4);
        if (0xffffff < uVar6) {
          *(uint *)(pDVar2 + (ulong)uVar7 + 4) = uVar6 - 0x1000000;
          uVar5 = (ulong)(uVar6 >> 0xf & 0x1fe);
          pCVar4 = (ConsCell *)((long)pDVar2 + uVar5 + (ulong)uVar7 * 2);
          *(uint *)(pDVar2 + (ulong)uVar7 + 4) =
               uVar6 - 0x1000000 & 0xff00ffff |
               (uint)*(byte *)((long)pDVar2 + uVar5 + (ulong)uVar7 * 2 + 3) << 0x10;
          break;
        }
        LVar8 = *(LispPTR *)(pDVar2 + (ulong)uVar7 + 6);
        pdVar3->dtd_nextpage = LVar8;
        (pDVar2 + (ulong)uVar7 + 6)[0] = 0xffff;
        (pDVar2 + (ulong)uVar7 + 6)[1] = 0xffff;
      } while (LVar8 != 0);
    }
    if (pCVar4 == (ConsCell *)0x0) {
      pcVar9 = next_conspage();
      uVar5 = (ulong)(*(uint *)&pcVar9->field_0x8 >> 0xf & 0x1fe);
      pCVar4 = (ConsCell *)((long)&pcVar9->cell6 + uVar5);
      uVar6 = *(uint *)&pcVar9->field_0x8 - 0x1000000;
      *(uint *)&pcVar9->field_0x8 = uVar6;
      *(uint *)&pcVar9->field_0x8 =
           uVar6 & 0xff00ffff | (uint)*(byte *)((long)&pcVar9->cell6 + uVar5 + 3) << 0x10;
      *(LispPTR *)((long)&pcVar9->cell6 + uVar5) = cons_car & 0xfffffff | 0x80000000;
      ListpDTD->dtd_oldcnt = ListpDTD->dtd_oldcnt + 1;
      goto LAB_00114bba;
    }
    *pCVar4 = (ConsCell)(cons_car & 0xfffffff | 0x80000000);
  }
  else {
    if ((((*(ushort *)((ulong)((uVar6 >> 9) * 2) + (long)MDStypetbl ^ 2) & 0x7ff) != 5) ||
        (pcVar9 = (conspage *)((ulong)((cons_cdr & 0xfffff00) * 2) + (long)Lisp_world),
        *(uint *)&pcVar9->field_0x8 < 0x1000000)) ||
       (pCVar4 = find_close_prior_cell(pcVar9,uVar6), pCVar4 == (ConsCell *)0x0)) {
      if (ListpDTD->dtd_nextpage != 0) {
        pcVar9 = (conspage *)(Lisp_world + (ListpDTD->dtd_nextpage << 8));
        do {
          pCVar4 = find_pair_in_page(pcVar9,uVar6);
          if (pCVar4 != (ConsCell *)0x0) goto LAB_00114aba;
          pLVar1 = &pcVar9->next_page;
          pcVar9 = (conspage *)(Lisp_world + (*pLVar1 << 8));
        } while (*pLVar1 != 0);
      }
      pcVar9 = next_conspage();
      pCVar4 = find_pair_in_page(pcVar9,uVar6);
LAB_00114aba:
      *pCVar4 = (ConsCell)((uint)*pCVar4 & 0xf0000000 | cons_car & 0xfffffff);
      ListpDTD->dtd_oldcnt = ListpDTD->dtd_oldcnt + 1;
      goto LAB_00114bba;
    }
    *pCVar4 = (ConsCell)((uint)*pCVar4 & 0xf0000000 | cons_car & 0xfffffff);
  }
  ListpDTD->dtd_cnt0 = ListpDTD->dtd_cnt0 + 1;
LAB_00114bba:
  if (((ulong)pCVar4 & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",pCVar4);
  }
  LVar8 = (LispPTR)((ulong)((long)pCVar4 - (long)Lisp_world) >> 1);
  if ((-1 < *(short *)((ulong)(((uint)((ulong)((long)pCVar4 - (long)Lisp_world) >> 10) & 0x7fffff) *
                              2) + (long)MDStypetbl ^ 2)) && (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(LVar8,1);
    }
    else {
      htfind(LVar8,1);
    }
  }
  if (0xfe < ((uint)*pCVar4 >> 0x1b & 0xe) + (LVar8 & 0xff)) {
    error("in CONS, cdr code too big.");
  }
  return LVar8;
}

Assistant:

LispPTR N_OP_cons(LispPTR cons_car, LispPTR cons_cdr) {
  struct conspage *new_conspage;
  ConsCell *new_cell;
#ifndef NEWCDRCODING
  ConsCell *temp_cell;
#endif
  LispPTR new_page; /* hold the return  val of nextconspage */

  GCLOOKUP(cons_cdr &= POINTERMASK, ADDREF);
  GCLOOKUP(cons_car, ADDREF);

  if (cons_cdr == NIL_PTR) {
#ifdef NEWCDRCODING
    if ((new_cell = find_free_cons_cell())) { /* next page has 1 or more free cells */
#else
    if ((ListpDTD->dtd_nextpage != 0) &&
        (GetCONSCount(ListpDTD->dtd_nextpage) > 0)) { /* next page has 1 or more free cells */
      new_page = ListpDTD->dtd_nextpage;
      new_conspage = (struct conspage *)NativeAligned4FromLPage(new_page);
      if (new_conspage->next_cell == 0) error("count ne 0, but nothing on free chain.");
      new_cell = GetNewCell_68k(new_conspage); /* get new cell */

      new_conspage->count--;                                       /* decrement free cnt. */
      new_conspage->next_cell = ((freecons *)new_cell)->next_free; /* update free cell chain */
#endif /* NEWCDRCODING */

      /* filling new cell with the data */
      new_cell->car_field = cons_car;
      new_cell->cdr_code = CDR_NIL;

      ListpDTD->dtd_cnt0++;

    }      /* if (ListpDTD.. end */
    else { /* Need to get a new CONS page */
      new_conspage = next_conspage();

      new_cell = GetNewCell_68k(new_conspage);

      new_conspage->count--;                                       /* decrement free cnt. */
      new_conspage->next_cell = ((freecons *)new_cell)->next_free; /* update free cell chain */

      /* filling new cell with the data */
      new_cell->car_field = cons_car;
      new_cell->cdr_code = CDR_NIL;

      ListpDTD->dtd_oldcnt++;

    }  /* else 1 end */
  }    /* if(cons_cdr.. end */
  else /* cons_cdr != NIL */
  {
    new_page = POINTER_PAGE(cons_cdr); /* Y's page num */
    new_conspage = (struct conspage *)NativeAligned4FromLPage(new_page);
#ifdef NEWCDRCODING
    if (Listp(cons_cdr) && (new_conspage->count > 0) &&
        (new_cell = find_close_prior_cell(new_conspage, cons_cdr)))
#else
    if (Listp(cons_cdr) && (new_conspage->count > 0))
#endif /* NEWCDRCODING */
    {  /* The cdr is itself a CONS cell, and can be */
       /* represented using CDR_ONPAGE representation */

#ifndef NEWCDRCODING
      new_cell = GetNewCell_68k(new_conspage);
#ifdef DEBUG
      if (new_cell->car_field != NIL) {
        printf("CELL 0x%x has non-NIL car = 0x%x \n", LAddrFromNative(new_cell),
               new_cell->car_field);
        error("QUIT from N_OP_cons");
      }
#endif

      new_conspage->count--;                                       /* decrement free cnt. */
      new_conspage->next_cell = ((freecons *)new_cell)->next_free; /* update free cell chain */
#endif                                                             /*NEWCDRCODING */

      new_cell->car_field = cons_car;
/* cdr_onpage + cell offset in this conspage */
#ifdef NEWCDRCODING
#else
      new_cell->cdr_code = CDR_ONPAGE | ((cons_cdr & 0xff) >> 1);
#endif /* NEWCDRCODING */
      ListpDTD->dtd_cnt0++;

    } /* if (listp.. end */
    else {
/* UFN case : CDR_INDIRECT */
#ifdef NEWCDRCODING
      new_cell = find_cdrcodable_pair(cons_cdr);
#else
      new_conspage = next_conspage();

      /* get 2 cells from conspage */
      temp_cell = GetNewCell_68k(new_conspage);
#ifdef DEBUG
      if (temp_cell->car_field != NIL) {
        printf("CDR indirect CELL 0x%x has non-NIL car 0x%x \n", LAddrFromNative(new_cell),
               temp_cell->car_field);
        error("QUIT from N_OP_cons");
      }
#endif

      new_conspage->next_cell = ((freecons *)temp_cell)->next_free; /* update free cell chain */
      new_cell = GetNewCell_68k(new_conspage);
#ifdef DEBUG
      if (new_cell->car_field != NIL) {
        printf("CDR ind-2 CELL 0x%x has non-NIL car = 0x%x \n", LAddrFromNative(new_cell),
               new_cell->car_field);
        error("QUIT from N_OP_cons");
      }
#endif

      new_conspage->next_cell = ((freecons *)new_cell)->next_free; /* update free cell chain */
      new_conspage->count -= 2;                                    /* decrement free cnt. */

      /* filling cell */
      *((LispPTR *)temp_cell) = cons_cdr; /* Indirect CDR ptr */
#endif /* NEWCDRCODING */
      new_cell->car_field = cons_car;

#ifndef NEWCDRCODING
      /* culc. cdr code */
      new_cell->cdr_code = (((LispPTR)LAddrFromNative(temp_cell)) & 0xff) >> 1;
#endif /* NEWCDRCODING */

      ListpDTD->dtd_oldcnt++; /* added feb-12 take */

    } /* else end */

  } /* else (cons_cdr==NIL end) */

  new_page = LAddrFromNative(new_cell);
  GCLOOKUP(new_page, DELREF);
#ifdef NEWCDRCODING
  if (254 < ((new_page & 0xff) + ((new_cell->cdr_code & 7) << 1)))
    error("in CONS, cdr code too big.");
#endif /* NEWCDRCODING */
  return (new_page);

} /* N_OP_cons() end */

/**********************************************************************/
/* function cons same as N_OP_cons				      */
/**********************************************************************/

LispPTR cons(LispPTR cons_car, LispPTR cons_cdr) { return (N_OP_cons(cons_car, cons_cdr)); }